

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  FILE *pFVar7;
  char *pcVar8;
  char cVar9;
  OPJ_UINT32 OVar10;
  uint uVar11;
  long lVar12;
  size_t sStack_e0;
  char endian2;
  char endian1;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int prec;
  int h;
  int w;
  FILE *local_b0;
  opj_image_t *local_a8;
  int local_9c;
  int local_98;
  OPJ_UINT32 local_94;
  OPJ_UINT32 OStack_90;
  OPJ_UINT32 OStack_8c;
  int iStack_88;
  int local_84;
  int local_80;
  uint local_7c;
  char temp [32];
  char signtmp [32];
  
  pFVar7 = fopen(filename,"rb");
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",filename);
    return (opj_image_t *)0x0;
  }
  fseek(pFVar7,0,0);
  pcVar8 = signtmp;
  iVar5 = __isoc99_fscanf(pFVar7,"PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",temp,&endian1,&endian2,
                          pcVar8,&prec,temp,&w,temp,&h);
  if (iVar5 == 9) {
    cVar9 = '+';
    do {
      if (*pcVar8 == '-') {
        cVar9 = '-';
      }
      else if (*pcVar8 == '\0') goto LAB_001073e2;
      pcVar8 = pcVar8 + 1;
    } while( true );
  }
  fclose(pFVar7);
  pcVar8 = "ERROR: Failed to read the right number of element from the fscanf() function!\n";
  sStack_e0 = 0x4e;
LAB_0010765b:
  fwrite(pcVar8,sStack_e0,1,_stderr);
  return (opj_image_t *)0x0;
LAB_001073e2:
  fgetc(pFVar7);
  iVar5 = prec;
  if (endian2 == 'L' && endian1 == 'M') {
    local_cc = 1;
  }
  else if ((endian1 != 'L') || (local_cc = 0, endian2 != 'M')) {
    fclose(pFVar7);
    pcVar8 = "Bad pgx header, please check input file\n";
    sStack_e0 = 0x28;
    goto LAB_0010765b;
  }
  OStack_8c = parameters->image_offset_x0;
  iStack_88 = parameters->image_offset_y0;
  local_9c = parameters->subsampling_dx;
  local_94 = OStack_8c + (w + -1) * local_9c + 1;
  local_98 = parameters->subsampling_dy;
  OStack_90 = (h + -1) * local_98 + iStack_88 + 1;
  local_7c = (uint)(cVar9 == '-');
  local_c8 = 0;
  local_c0 = 0;
  local_c4 = 0;
  if (prec < 8) {
    local_c0 = 8 - prec;
    local_c4 = prec - local_c0;
    local_c8 = 0;
    if (cVar9 == '-') {
      local_c8 = 1 << ((char)prec - 1U & 0x1f);
    }
    local_7c = 0;
    prec = 8;
  }
  OVar10 = 1;
  local_84 = prec;
  local_80 = prec;
  local_a8 = (opj_image_t *)opj_image_create(1,&local_9c,2);
  if (local_a8 == (opj_image_t *)0x0) {
    fclose(pFVar7);
    return (opj_image_t *)0x0;
  }
  local_a8->x0 = OStack_8c;
  local_a8->y0 = OStack_8c;
  local_a8->x1 = local_94;
  local_a8->y1 = OStack_90;
  poVar2 = local_a8->comps;
  uVar11 = 0;
  local_b0 = pFVar7;
  for (lVar12 = 0; lVar12 < (long)h * (long)w; lVar12 = lVar12 + 1) {
    if (iVar5 < 8) {
      bVar3 = readuchar((FILE *)pFVar7);
      uVar6 = ((uint)bVar3 + local_c8 >> ((byte)local_c4 & 0x1f)) +
              ((uint)bVar3 + local_c8 << ((byte)local_c0 & 0x1f));
      poVar2->data[lVar12] = uVar6 & 0xff;
      if ((int)uVar11 < (int)uVar6) {
        uVar11 = uVar6;
      }
    }
    else {
      if (poVar2->prec == 8) {
        OVar1 = poVar2->sgnd;
        bVar3 = readuchar((FILE *)pFVar7);
        pFVar7 = local_b0;
        if (OVar1 == 0) {
          uVar6 = (uint)bVar3;
        }
        else {
          uVar6 = (uint)(char)bVar3;
        }
      }
      else if (poVar2->prec < 0x11) {
        OVar1 = poVar2->sgnd;
        uVar4 = readushort((FILE *)pFVar7,local_cc);
        pFVar7 = local_b0;
        if (OVar1 == 0) {
          uVar6 = (uint)uVar4;
        }
        else {
          uVar6 = (uint)(short)uVar4;
        }
      }
      else {
        uVar6 = readuint((FILE *)pFVar7,local_cc);
      }
      if ((int)uVar11 < (int)uVar6) {
        uVar11 = uVar6;
      }
      poVar2->data[lVar12] = uVar6;
    }
  }
  fclose(pFVar7);
  for (; 1 < (int)uVar11; uVar11 = uVar11 >> 1) {
    OVar10 = OVar10 + 1;
  }
  poVar2->bpp = OVar10;
  return local_a8;
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters) {
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;	/* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;

    char endian1,endian2,sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if( fscanf(f, "PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",temp,&endian1,&endian2,signtmp,&prec,temp,&w,temp,&h) != 9){
        fclose(f);
        fprintf(stderr, "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i=0;
    sign='+';
    while (signtmp[i]!='\0') {
        if (signtmp[i]=='-') sign='-';
        i++;
    }

    fgetc(f);
    if (endian1=='M' && endian2=='L') {
        bigendian = 1;
    } else if (endian2=='M' && endian1=='L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx + 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy + 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if(prec < 8)
    {
        force8 = 1;
        ushift = 8 - prec; dshift = prec - ushift;
        if(cmptparm.sgnd) adjustS = (1<<(prec - 1)); else adjustS = 0;
        cmptparm.sgnd = 0;
        prec = 8;
    }
    else ushift = dshift = force8 = adjustS = 0;

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.bpp = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if(!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if(force8)
        {
            v = readuchar(f) + adjustS;
            v = (v<<ushift) + (v>>dshift);
            comp->data[i] = (unsigned char)v;

            if(v > max) max = v;

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max)
            max = v;
        comp->data[i] = v;
    }
    fclose(f);
    comp->bpp = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}